

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
          *this)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  Value unaff_RBX;
  TypedTermList lhs;
  OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  local_48;
  Value local_38;
  
  if ((this->_current).
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._isSome == true) {
    do {
      cVar2 = (**(code **)(*(long *)(this->_current).
                                    super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                                    ._elem._elem + 0x10))();
      if (cVar2 != '\0') {
        return (bool)cVar2;
      }
      iVar3 = (*((this->_master)._inner._core)->_vptr_IteratorCore[2])();
      if ((char)iVar3 == '\0') {
        local_48._isSome = false;
        local_48._1_7_ = 0;
        local_48._elem._elem = (Value)0x0;
      }
      else {
        iVar4 = (*((this->_master)._inner._core)->_vptr_IteratorCore[3])();
        lhs._sort._content._4_4_ = extraout_var;
        lhs._sort._content._0_4_ = iVar4;
        lhs.super_TermList._content = (uint64_t)this;
        Inferences::BackwardDemodulation::RewritableClausesFn::operator()
                  ((RewritableClausesFn *)&local_38.init,lhs);
        unaff_RBX = local_38;
        if (local_38 == (Value)0x0) {
          local_48._isSome = true;
          local_48._elem._elem = (Value)0x0;
          unaff_RBX = (Value)0x0;
        }
        else {
          local_48._isSome = true;
          local_48._elem._elem = local_38;
          iVar4 = *(int *)((long)local_38 + 8) + 2;
          *(int *)((long)local_38 + 8) = iVar4;
          if (iVar4 == 0) {
            (**(code **)(*(long *)local_38 + 8))(local_38);
          }
        }
      }
      OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ::operator=(&(this->_current).
                   super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                  ,&local_48);
      if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
        plVar1 = (long *)((long)local_48._elem._elem + 8);
        *(int *)plVar1 = *(int *)plVar1 + -1;
        if (*(int *)plVar1 == 0) {
          (**(code **)(*(long *)local_48._elem._elem + 8))();
        }
      }
      if ((char)iVar3 != '\0') {
        if (unaff_RBX != (Value)0x0) {
          plVar1 = (long *)((long)unaff_RBX + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)unaff_RBX + 8))(unaff_RBX);
          }
        }
        if (local_38 != (Value)0x0) {
          plVar1 = (long *)((long)local_38 + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)local_38 + 8))();
          }
        }
      }
    } while ((this->_current).
             super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
             ._isSome != false);
  }
  return false;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }